

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long_long lhs,
         SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  unsigned_long_long ret;
  unsigned_short local_24;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  unsigned_long_long local_20;
  unsigned_long_long local_18;
  
  local_20 = 0;
  local_24 = rhs.m_int;
  local_18 = lhs;
  DivisionHelper<unsigned_long_long,_unsigned_short,_0>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_18,&local_24,&local_20);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long_long>(&local_22,&local_20);
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_22.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}